

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# repeated_field.h
# Opt level: O0

void __thiscall google::protobuf::RepeatedField<bool>::Add(RepeatedField<bool> *this,bool value)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  bool *pbVar4;
  int final_capacity;
  bool *final_elements;
  int final_size;
  bool final_is_soo;
  void *p;
  bool *pbStack_28;
  int new_size;
  bool *elem;
  int capacity;
  int old_size;
  bool is_soo;
  bool value_local;
  RepeatedField<bool> *this_local;
  
  capacity._2_1_ = RepeatedField<bool>::is_soo(this);
  iVar2 = size(this,capacity._2_1_);
  elem._4_4_ = Capacity(this,capacity._2_1_);
  pbStack_28 = unsafe_elements(this,capacity._2_1_);
  if (iVar2 == elem._4_4_) {
    Grow(this,capacity._2_1_,iVar2,iVar2 + 1);
    capacity._2_1_ = false;
    elem._4_4_ = Capacity(this,false);
    pbStack_28 = unsafe_elements(this,false);
  }
  iVar3 = ExchangeCurrentSize(this,capacity._2_1_,iVar2 + 1);
  pbStack_28[iVar3] = value;
  bVar1 = RepeatedField<bool>::is_soo(this);
  if (capacity._2_1_ != bVar1) {
    internal::protobuf_assumption_failed
              ("is_soo == final_is_soo",
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/repeated_field.h"
               ,0x366);
  }
  iVar3 = size(this,capacity._2_1_);
  if (iVar2 + 1 != iVar3) {
    internal::protobuf_assumption_failed
              ("new_size == final_size",
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/repeated_field.h"
               ,0x368);
  }
  pbVar4 = unsafe_elements(this,capacity._2_1_);
  if (pbStack_28 != pbVar4) {
    internal::protobuf_assumption_failed
              ("elem == final_elements",
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/repeated_field.h"
               ,0x36a);
  }
  iVar2 = Capacity(this,capacity._2_1_);
  if (elem._4_4_ != iVar2) {
    internal::protobuf_assumption_failed
              ("capacity == final_capacity",
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/repeated_field.h"
               ,0x36c);
  }
  return;
}

Assistant:

inline void RepeatedField<Element>::Add(Element value) {
  bool is_soo = this->is_soo();
  const int old_size = size(is_soo);
  int capacity = Capacity(is_soo);
  Element* elem = unsafe_elements(is_soo);
  if (ABSL_PREDICT_FALSE(old_size == capacity)) {
    Grow(is_soo, old_size, old_size + 1);
    is_soo = false;
    capacity = Capacity(is_soo);
    elem = unsafe_elements(is_soo);
  }
  int new_size = old_size + 1;
  void* p = elem + ExchangeCurrentSize(is_soo, new_size);
  ::new (p) Element(std::move(value));

  // The below helps the compiler optimize dense loops.
  // Note: we can't call functions in PROTOBUF_ASSUME so use local variables.
  [[maybe_unused]] const bool final_is_soo = this->is_soo();
  PROTOBUF_ASSUME(is_soo == final_is_soo);
  [[maybe_unused]] const int final_size = size(is_soo);
  PROTOBUF_ASSUME(new_size == final_size);
  [[maybe_unused]] Element* const final_elements = unsafe_elements(is_soo);
  PROTOBUF_ASSUME(elem == final_elements);
  [[maybe_unused]] const int final_capacity = Capacity(is_soo);
  PROTOBUF_ASSUME(capacity == final_capacity);
}